

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleVertexArrayNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider __s2;
  int iVar2;
  Property *prop;
  DataArrayList *pDVar3;
  runtime_error *this_00;
  string propName;
  string propKey;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  if (node == (DDLNode *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"No parent node for name.","");
    std::runtime_error::runtime_error(this_00,(string *)local_90);
    *(undefined ***)this_00 = &PTR__runtime_error_008dc448;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prop = ODDLParser::DDLNode::getProperties(node);
  if (prop == (Property *)0x0) {
    return;
  }
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  propId2StdString(prop,&local_70,&local_50);
  __s2._M_p = local_50._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    __assert_fail("nullptr != attribName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x2ee,"MeshAttribute Assimp::OpenGEX::getAttributeByName(const char *)");
  }
  iVar2 = strncmp(PosToken_abi_cxx11_,local_50._M_dataplus._M_p,DAT_009b85e8);
  if (iVar2 == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = strncmp(ColToken_abi_cxx11_,__s2._M_p,DAT_009b8608);
    if (iVar2 == 0) {
      iVar2 = 2;
    }
    else {
      iVar2 = strncmp(NormalToken_abi_cxx11_,__s2._M_p,DAT_009b8628);
      if (iVar2 == 0) {
        iVar2 = 3;
      }
      else {
        iVar2 = strncmp(TexCoordToken_abi_cxx11_,__s2._M_p,DAT_009b8648);
        if (iVar2 != 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__s2._M_p != paVar1) {
            operator_delete(__s2._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == &local_70.field_2) {
            return;
          }
          goto LAB_00469160;
        }
        iVar2 = 4;
      }
    }
  }
  pDVar3 = ODDLParser::DDLNode::getDataArrayList(node);
  if (pDVar3 != (DataArrayList *)0x0) {
    do {
      pDVar3 = pDVar3->m_next;
    } while (pDVar3 != (DataArrayList *)0x0);
    (*(code *)(&DAT_00766974 + *(int *)(&DAT_00766974 + (ulong)(iVar2 - 1) * 4)))();
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return;
  }
LAB_00469160:
  operator_delete(local_70._M_dataplus._M_p);
  return;
}

Assistant:

void OpenGEXImporter::handleVertexArrayNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    Property *prop( node->getProperties() );
    if( nullptr != prop ) {
        std::string propName, propKey;
        propId2StdString( prop, propName, propKey );
        MeshAttribute attribType( getAttributeByName( propKey.c_str() ) );
        if( None == attribType ) {
            return;
        }

        DataArrayList *vaList = node->getDataArrayList();
        if( nullptr == vaList ) {
            return;
        }

        const size_t numItems( countDataArrayListItems( vaList ) );

        if( Position == attribType ) {
            m_currentVertices.m_vertices.resize( numItems );
            copyVectorArray( numItems, vaList, m_currentVertices.m_vertices.data() );
        } else if ( Color == attribType ) {
            m_currentVertices.m_numColors = numItems;
            m_currentVertices.m_colors = new aiColor4D[ numItems ];
            copyColor4DArray( numItems, vaList, m_currentVertices.m_colors );
        } else if( Normal == attribType ) {
            m_currentVertices.m_normals.resize( numItems );
            copyVectorArray( numItems, vaList, m_currentVertices.m_normals.data() );
        } else if( TexCoord == attribType ) {
            m_currentVertices.m_numUVComps[ 0 ] = numItems;
            m_currentVertices.m_textureCoords[ 0 ] = new aiVector3D[ numItems ];
            copyVectorArray( numItems, vaList, m_currentVertices.m_textureCoords[ 0 ] );
        }
    }
}